

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::ClearFreeMemory(ImDrawList *this)

{
  ImDrawCmd *pIVar1;
  unsigned_short *puVar2;
  ImDrawVert *ptr;
  ImVec4 *ptr_00;
  void **ptr_01;
  ImVec2 *ptr_02;
  void *ptr_03;
  long lVar3;
  ImDrawChannel *pIVar4;
  long lVar5;
  
  pIVar1 = (this->CmdBuffer).Data;
  if (pIVar1 != (ImDrawCmd *)0x0) {
    (this->CmdBuffer).Size = 0;
    (this->CmdBuffer).Capacity = 0;
    ImGui::MemFree(pIVar1);
    (this->CmdBuffer).Data = (ImDrawCmd *)0x0;
  }
  puVar2 = (this->IdxBuffer).Data;
  if (puVar2 != (unsigned_short *)0x0) {
    (this->IdxBuffer).Size = 0;
    (this->IdxBuffer).Capacity = 0;
    ImGui::MemFree(puVar2);
    (this->IdxBuffer).Data = (unsigned_short *)0x0;
  }
  ptr = (this->VtxBuffer).Data;
  if (ptr != (ImDrawVert *)0x0) {
    (this->VtxBuffer).Size = 0;
    (this->VtxBuffer).Capacity = 0;
    ImGui::MemFree(ptr);
    (this->VtxBuffer).Data = (ImDrawVert *)0x0;
  }
  this->_VtxCurrentIdx = 0;
  this->_VtxWritePtr = (ImDrawVert *)0x0;
  this->_IdxWritePtr = (ImDrawIdx *)0x0;
  ptr_00 = (this->_ClipRectStack).Data;
  if (ptr_00 != (ImVec4 *)0x0) {
    (this->_ClipRectStack).Size = 0;
    (this->_ClipRectStack).Capacity = 0;
    ImGui::MemFree(ptr_00);
    (this->_ClipRectStack).Data = (ImVec4 *)0x0;
  }
  ptr_01 = (this->_TextureIdStack).Data;
  if (ptr_01 != (void **)0x0) {
    (this->_TextureIdStack).Size = 0;
    (this->_TextureIdStack).Capacity = 0;
    ImGui::MemFree(ptr_01);
    (this->_TextureIdStack).Data = (void **)0x0;
  }
  ptr_02 = (this->_Path).Data;
  if (ptr_02 != (ImVec2 *)0x0) {
    (this->_Path).Size = 0;
    (this->_Path).Capacity = 0;
    ImGui::MemFree(ptr_02);
    (this->_Path).Data = (ImVec2 *)0x0;
  }
  this->_ChannelsCurrent = 0;
  this->_ChannelsCount = 1;
  if (0 < (this->_Channels).Size) {
    lVar5 = 0;
    lVar3 = 0;
    do {
      pIVar4 = (this->_Channels).Data;
      if (lVar5 == 0) {
        (pIVar4->IdxBuffer).Size = 0;
        (pIVar4->IdxBuffer).Capacity = 0;
        (pIVar4->IdxBuffer).Data = (unsigned_short *)0x0;
        (pIVar4->CmdBuffer).Size = 0;
        (pIVar4->CmdBuffer).Capacity = 0;
        (pIVar4->CmdBuffer).Data = (ImDrawCmd *)0x0;
        pIVar4 = (this->_Channels).Data;
        pIVar1 = (pIVar4->CmdBuffer).Data;
        if (pIVar1 != (ImDrawCmd *)0x0) {
          (pIVar4->CmdBuffer).Size = 0;
          (pIVar4->CmdBuffer).Capacity = 0;
          ImGui::MemFree(pIVar1);
          (pIVar4->CmdBuffer).Data = (ImDrawCmd *)0x0;
          pIVar4 = (this->_Channels).Data;
        }
      }
      else {
        ptr_03 = *(void **)((long)&(pIVar4->CmdBuffer).Data + lVar5);
        if (ptr_03 != (void *)0x0) {
          *(undefined8 *)((long)&(pIVar4->CmdBuffer).Size + lVar5) = 0;
          ImGui::MemFree(ptr_03);
          *(undefined8 *)((long)&(pIVar4->CmdBuffer).Data + lVar5) = 0;
          pIVar4 = (this->_Channels).Data;
        }
        pIVar4 = (ImDrawChannel *)((long)&(pIVar4->CmdBuffer).Size + lVar5);
      }
      puVar2 = (pIVar4->IdxBuffer).Data;
      if (puVar2 != (unsigned_short *)0x0) {
        (pIVar4->IdxBuffer).Size = 0;
        (pIVar4->IdxBuffer).Capacity = 0;
        ImGui::MemFree(puVar2);
        (pIVar4->IdxBuffer).Data = (unsigned_short *)0x0;
      }
      lVar3 = lVar3 + 1;
      lVar5 = lVar5 + 0x20;
    } while (lVar3 < (this->_Channels).Size);
  }
  pIVar4 = (this->_Channels).Data;
  if (pIVar4 != (ImDrawChannel *)0x0) {
    (this->_Channels).Size = 0;
    (this->_Channels).Capacity = 0;
    ImGui::MemFree(pIVar4);
    (this->_Channels).Data = (ImDrawChannel *)0x0;
  }
  return;
}

Assistant:

void ImDrawList::ClearFreeMemory()
{
    CmdBuffer.clear();
    IdxBuffer.clear();
    VtxBuffer.clear();
    _VtxCurrentIdx = 0;
    _VtxWritePtr = NULL;
    _IdxWritePtr = NULL;
    _ClipRectStack.clear();
    _TextureIdStack.clear();
    _Path.clear();
    _ChannelsCurrent = 0;
    _ChannelsCount = 1;
    for (int i = 0; i < _Channels.Size; i++)
    {
        if (i == 0) memset(&_Channels[0], 0, sizeof(_Channels[0]));  // channel 0 is a copy of CmdBuffer/IdxBuffer, don't destruct again
        _Channels[i].CmdBuffer.clear();
        _Channels[i].IdxBuffer.clear();
    }
    _Channels.clear();
}